

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_exclude_entry(archive *_a,wchar_t flag,archive_entry *entry)

{
  int iVar1;
  long in_RDX;
  undefined4 in_ESI;
  archive *in_RDI;
  wchar_t magic_test;
  wchar_t r;
  archive_match *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  char *in_stack_ffffffffffffffc8;
  wchar_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else if (in_RDX == 0) {
    archive_set_error(in_RDI,0x16,"entry is NULL");
    wVar2 = L'\xffffffe7';
  }
  else {
    wVar2 = validate_time_flag(in_RDI,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
    if (wVar2 == L'\0') {
      wVar2 = add_entry((archive_match *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (wchar_t)((ulong)in_RDI >> 0x20),
                        (archive_entry *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    }
  }
  return wVar2;
}

Assistant:

int
archive_match_exclude_entry(struct archive *_a, int flag,
    struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_time_include_entry");
	a = (struct archive_match *)_a;

	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}
	r = validate_time_flag(_a, flag, "archive_match_exclude_entry");
	if (r != ARCHIVE_OK)
		return (r);
	return (add_entry(a, flag, entry));
}